

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::UpdateImpl(cmCTestVC *this)

{
  cmCTest *this_00;
  ostream *this_01;
  char *msg;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream cmCTestLog_msg;
  cmCTestVC *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  this_01 = std::operator<<((ostream *)local_188,"* Unknown VCS tool, not updating!");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  this_00 = this->CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestVC.cxx"
               ,0xbc,msg,false);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return true;
}

Assistant:

bool cmCTestVC::UpdateImpl()
{
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "* Unknown VCS tool, not updating!" << std::endl);
  return true;
}